

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall InterpreterTestSuite::InitContext(InterpreterTestSuite *this,TestContext *ctx)

{
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *this_00;
  char *pcVar1;
  AssertionResult gtest_ar_2;
  string local_130;
  Error result;
  MatcherBase<const_ot::commissioner::Config_&> local_d8;
  WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_interpreter_test_cpp:110:34),_0UL>
  local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  TestContext *local_b0;
  DoAllAction local_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0 [2];
  string configFile;
  Error error;
  undefined1 local_48 [8];
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  std::__cxx11::string::string((string *)&configFile,"./tmp/config",(allocator *)&result);
  std::__cxx11::string::string
            ((string *)&result,"{\"ThreadSMRoot\": \"./tmp\"}",(allocator *)&gtest_ar_2);
  ot::commissioner::WriteFile(&error,(string *)&result,&configFile);
  std::__cxx11::string::~string((string *)&result);
  gtest_ar_2._0_4_ = error.mCode;
  local_130._M_dataplus._M_p._0_4_ = kNone;
  testing::internal::CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
            ((internal *)&result,"error.GetCode()","ErrorCode::kNone",(ErrorCode *)&gtest_ar_2,
             (ErrorCode *)&local_130);
  if ((undefined1)result.mCode == kNone) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (result.mMessage._M_dataplus._M_p == (pointer)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)result.mMessage._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_130,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x68,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)&gtest_ar_2);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&result.mMessage);
    gtest_ar_2.success_ = false;
    gtest_ar_2._1_7_ = 0;
    testing::internal::CmpHelperNE<std::shared_ptr<CommissionerAppMock>,decltype(nullptr)>
              ((internal *)&result,"ctx.mDefaultCommissionerObject","nullptr",
               &ctx->mDefaultCommissionerObject,(void **)&gtest_ar_2);
    if ((undefined1)result.mCode != kNone) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&result.mMessage);
      testing::A<std::shared_ptr<ot::commissioner::CommissionerApp>&>();
      testing::A<ot::commissioner::Config_const&>();
      CommissionerAppStaticExpecter::gmock_Create
                ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                  *)&result,&ctx->mCommissionerAppStaticExpecter,
                 (Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)&local_130,
                 (Matcher<const_ot::commissioner::Config_&> *)&local_d8);
      testing::internal::GetWithoutMatchers();
      pcVar1 = "ctx.mCommissionerAppStaticExpecter";
      this_00 = testing::internal::
                MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                ::InternalExpectedAt
                          ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                            *)&result,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                           ,0x6c,"ctx.mCommissionerAppStaticExpecter","Create(_, _)");
      local_48._0_4_ = kNone;
      local_40._M_p = (pointer)&local_30;
      local_38 = 0;
      local_30._M_local_buf[0] = '\0';
      local_b0 = ctx;
      testing::Return<ot::commissioner::Error>((testing *)&local_c0,(Error *)local_48);
      testing::
      DoAll<testing::internal::WithArgsAction<InterpreterTestSuite::InitContext(InterpreterTestSuite::TestContext&)::_lambda(std::shared_ptr<ot::commissioner::CommissionerApp>&)_1_,0ul>,testing::internal::ReturnAction<ot::commissioner::Error>>
                ((DoAllAction<testing::internal::WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_interpreter_test_cpp:110:34),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
                  *)local_a8,(testing *)&local_b0,&local_c0,
                 (ReturnAction<ot::commissioner::Error> *)pcVar1);
      testing::internal::DoAllAction::operator_cast_to_Action
                ((Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                  *)&gtest_ar_2,local_a8);
      testing::internal::
      TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
      ::WillOnce(this_00,(Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                          *)&gtest_ar_2);
      std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_2);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_a0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8);
      std::__cxx11::string::~string((string *)&local_40);
      std::
      _Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
      ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
                      *)&result.mMessage);
      testing::internal::MatcherBase<const_ot::commissioner::Config_&>::~MatcherBase(&local_d8);
      testing::internal::MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>::
      ~MatcherBase((MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)&local_130);
      std::__cxx11::string::string((string *)&gtest_ar_2,"./tmp/config",(allocator *)&local_d8);
      pcVar1 = "";
      std::__cxx11::string::string((string *)&local_130,"",(allocator *)local_a8);
      ot::commissioner::Interpreter::Init
                (&result,&ctx->mInterpreter,(string *)&gtest_ar_2,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&gtest_ar_2);
      local_130._M_dataplus._M_p._0_4_ = result.mCode;
      local_d8._vptr_MatcherBase._0_4_ = 0;
      testing::internal::CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
                ((internal *)&gtest_ar_2,"result.GetCode()","ErrorCode::kNone",
                 (ErrorCode *)&local_130,(ErrorCode *)&local_d8);
      if (gtest_ar_2.success_ == false) {
        testing::Message::Message((Message *)&local_130);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_2.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar1 = *(char **)gtest_ar_2.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x72,pcVar1);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)&local_130);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
        if ((long *)CONCAT44(local_130._M_dataplus._M_p._4_4_,(ErrorCode)local_130._M_dataplus._M_p)
            != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_130._M_dataplus._M_p._4_4_,
                                         (ErrorCode)local_130._M_dataplus._M_p) + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_2.message_);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_2.message_);
        ctx->mRegistry =
             (ctx->mInterpreter).mRegistry.
             super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
        gtest_ar_2._0_2_ = 0x3031;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_assign_aux<unsigned_char_const*>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                   &(((ctx->mInterpreter).mJobManager.
                      super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mDefaultConf).mPSKc,&gtest_ar_2,&gtest_ar_2.field_0x2);
      }
      std::__cxx11::string::~string((string *)&result.mMessage);
      goto LAB_00185f45;
    }
    testing::Message::Message((Message *)&gtest_ar_2);
    if (result.mMessage._M_dataplus._M_p == (pointer)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)result.mMessage._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_130,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x6a,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)&gtest_ar_2);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
  if (gtest_ar_2._0_8_ != 0) {
    (**(code **)(*(long *)gtest_ar_2._0_8_ + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&result.mMessage);
LAB_00185f45:
  std::__cxx11::string::~string((string *)&error.mMessage);
  std::__cxx11::string::~string((string *)&configFile);
  return;
}

Assistant:

void InitContext(TestContext &ctx)
    {
        // Minimum test setup: create config file
        const std::string configFile = "./tmp/config";
        auto              error      = WriteFile("{\"ThreadSMRoot\": \"./tmp\"}", configFile);
        ASSERT_EQ(error.GetCode(), ErrorCode::kNone);

        ASSERT_NE(ctx.mDefaultCommissionerObject, nullptr);

        EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
            .WillOnce(
                DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = ctx.mDefaultCommissionerObject; }),
                      Return(Error{})));

        auto result = ctx.mInterpreter.Init("./tmp/config", "");
        ASSERT_EQ(result.GetCode(), ErrorCode::kNone);

        ctx.mRegistry = ctx.mInterpreter.mRegistry.get();

        // Add formal default PSKc
        ctx.mInterpreter.mJobManager->mDefaultConf.mPSKc = {'1', '0'};
    }